

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::internal_node<char,_false>_> __thiscall
immutable::rrb_details::concat_sub_tree<char,false,5>
          (rrb_details *this,ref<immutable::rrb_details::tree_node<char,_false>_> *left_node,
          uint32_t left_shift,ref<immutable::rrb_details::tree_node<char,_false>_> *right_node,
          uint32_t right_shift,bool is_top)

{
  uint32_t uVar1;
  internal_node<char,_false> *__ptr;
  internal_node<char,_false> *__ptr_00;
  undefined8 *puVar2;
  ulong uVar3;
  char *__function;
  uint uVar4;
  ref<immutable::rrb_details::internal_node<char,_false>_> left_internal;
  ref<immutable::rrb_details::tree_node<char,_false>_> left_node_temp;
  ref<immutable::rrb_details::internal_node<char,_false>_> centre_node;
  ref<immutable::rrb_details::internal_node<char,_false>_> empty;
  ref<immutable::rrb_details::internal_node<char,_false>_> centre_node_2;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_58;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_50;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_48;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_40;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_38;
  
  if (right_shift < left_shift) {
    local_58.ptr = (internal_node<char,_false> *)left_node->ptr;
    if (local_58.ptr != (internal_node<char,_false> *)0x0) {
      (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
      local_50.ptr = (local_58.ptr)->child[(local_58.ptr)->len - 1].ptr;
      if (local_50.ptr != (internal_node<char,_false> *)0x0) {
        (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
      }
      concat_sub_tree<char,false,5>
                ((rrb_details *)&local_48,
                 (ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50,left_shift - 5,
                 right_node,right_shift,false);
      local_40.ptr = (internal_node<char,_false> *)0x0;
      rebalance<char,false,5>(this,&local_58,&local_48,&local_40,left_shift,is_top);
      release<char>(local_40.ptr);
      release<char>(local_48.ptr);
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
      release<char>(local_58.ptr);
      return (ref<immutable::rrb_details::internal_node<char,_false>_>)
             (internal_node<char,_false> *)this;
    }
  }
  else if (left_shift < right_shift) {
    local_58.ptr = (internal_node<char,_false> *)right_node->ptr;
    if (local_58.ptr != (internal_node<char,_false> *)0x0) {
      (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
      local_50.ptr = (local_58.ptr)->child->ptr;
      if (local_50.ptr != (internal_node<char,_false> *)0x0) {
        (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
      }
      concat_sub_tree<char,false,5>
                ((rrb_details *)&local_48,left_node,left_shift,
                 (ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50,right_shift - 5,
                 false);
      local_40.ptr = (internal_node<char,_false> *)0x0;
      rebalance<char,false,5>(this,&local_40,&local_48,&local_58,right_shift,is_top);
      release<char>(local_40.ptr);
      release<char>(local_48.ptr);
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
      release<char>(local_58.ptr);
      return (ref<immutable::rrb_details::internal_node<char,_false>_>)
             (internal_node<char,_false> *)this;
    }
  }
  else {
    if (left_shift == 0) {
      __ptr = (internal_node<char,_false> *)left_node->ptr;
      if (__ptr != (internal_node<char,_false> *)0x0) {
        __ptr->_ref_count = __ptr->_ref_count + 1;
      }
      __ptr_00 = (internal_node<char,_false> *)right_node->ptr;
      if (__ptr_00 != (internal_node<char,_false> *)0x0) {
        __ptr_00->_ref_count = __ptr_00->_ref_count + 1;
      }
      if (is_top) {
        if ((__ptr == (internal_node<char,_false> *)0x0) ||
           (__ptr_00 == (internal_node<char,_false> *)0x0)) {
          __function = 
          "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
          ;
          goto LAB_00145abc;
        }
        if (__ptr_00->len + __ptr->len < 0x21) {
          uVar4 = __ptr_00->len + __ptr->len;
          local_58.ptr = (internal_node<char,_false> *)malloc((ulong)uVar4 + 0x18);
          (local_58.ptr)->len = uVar4;
          (local_58.ptr)->type = LEAF_NODE;
          ((local_58.ptr)->size_table).ptr = (rrb_size_table<false> *)&(local_58.ptr)->child;
          (local_58.ptr)->guid = 0;
          if (uVar4 != 0) {
            uVar3 = 0;
            do {
              *(undefined1 *)((long)&(((local_58.ptr)->size_table).ptr)->size + uVar3) = 0;
              uVar3 = uVar3 + 1;
            } while (uVar4 != uVar3);
          }
          if (__ptr->len != 0) {
            uVar3 = 0;
            do {
              *(undefined1 *)((long)&(((local_58.ptr)->size_table).ptr)->size + uVar3) =
                   *(undefined1 *)((long)&((__ptr->size_table).ptr)->size + uVar3);
              uVar3 = uVar3 + 1;
            } while (uVar3 < __ptr->len);
          }
          if (__ptr_00->len != 0) {
            uVar3 = 0;
            do {
              *(undefined1 *)
               ((long)&(((local_58.ptr)->size_table).ptr)->size + (ulong)(__ptr->len + (int)uVar3))
                   = *(undefined1 *)((long)&((__ptr_00->size_table).ptr)->size + uVar3);
              uVar3 = uVar3 + 1;
            } while (uVar3 < __ptr_00->len);
          }
          (local_58.ptr)->_ref_count = 1;
          puVar2 = (undefined8 *)malloc(0x28);
          *puVar2 = 0x100000001;
          puVar2[2] = 0;
          *(undefined4 *)((long)puVar2 + 0xc) = 0;
          puVar2[3] = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(puVar2 + 4);
          puVar2[4] = 0;
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,_false>_> *)(puVar2 + 4),
                     &local_58);
          *(undefined8 **)this = puVar2;
          *(undefined4 *)(puVar2 + 1) = 1;
          release<char>(local_58.ptr);
          goto LAB_00145a60;
        }
      }
      if (__ptr != (internal_node<char,_false> *)0x0) {
        __ptr->_ref_count = __ptr->_ref_count + 1;
      }
      if (__ptr_00 != (internal_node<char,_false> *)0x0) {
        __ptr_00->_ref_count = __ptr_00->_ref_count + 1;
      }
      local_58.ptr = __ptr;
      local_50.ptr = __ptr_00;
      puVar2 = (undefined8 *)malloc(0x30);
      *puVar2 = 0x200000001;
      puVar2[2] = 0;
      *(undefined4 *)((long)puVar2 + 0xc) = 0;
      puVar2[3] = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(puVar2 + 4);
      puVar2[4] = 0;
      puVar2[5] = 0;
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)(puVar2 + 4),&local_58)
      ;
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)(puVar2[3] + 8),
                 &local_50);
      *(undefined8 **)this = puVar2;
      *(undefined4 *)(puVar2 + 1) = 1;
      release<char>(local_50.ptr);
      release<char>(local_58.ptr);
LAB_00145a60:
      if ((__ptr_00 != (internal_node<char,_false> *)0x0) &&
         (uVar1 = __ptr_00->_ref_count, __ptr_00->_ref_count = uVar1 - 1, uVar1 == 1)) {
        free(__ptr_00);
      }
      if ((__ptr != (internal_node<char,_false> *)0x0) &&
         (uVar1 = __ptr->_ref_count, __ptr->_ref_count = uVar1 - 1, uVar1 == 1)) {
        free(__ptr);
      }
      return (ref<immutable::rrb_details::internal_node<char,_false>_>)
             (internal_node<char,_false> *)this;
    }
    local_58.ptr = (internal_node<char,_false> *)left_node->ptr;
    if (local_58.ptr != (internal_node<char,_false> *)0x0) {
      (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
    }
    local_50.ptr = (internal_node<char,_false> *)right_node->ptr;
    if (local_50.ptr != (internal_node<char,_false> *)0x0) {
      (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
    }
    if (local_58.ptr != (internal_node<char,_false> *)0x0) {
      local_48.ptr = (local_58.ptr)->child[(local_58.ptr)->len - 1].ptr;
      if (local_48.ptr != (internal_node<char,_false> *)0x0) {
        (local_48.ptr)->_ref_count = (local_48.ptr)->_ref_count + 1;
      }
      if (local_50.ptr != (internal_node<char,_false> *)0x0) {
        local_40.ptr = (local_50.ptr)->child->ptr;
        if (local_40.ptr != (internal_node<char,_false> *)0x0) {
          (local_40.ptr)->_ref_count = (local_40.ptr)->_ref_count + 1;
        }
        concat_sub_tree<char,false,5>
                  ((rrb_details *)&local_38,
                   (ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_48,left_shift - 5,
                   (ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_40,right_shift - 5
                   ,false);
        rebalance<char,false,5>(this,&local_58,&local_38,&local_50,left_shift,is_top);
        release<char>(local_38.ptr);
        ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_40);
        ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_48);
        release<char>(local_50.ptr);
        release<char>(local_58.ptr);
        return (ref<immutable::rrb_details::internal_node<char,_false>_>)
               (internal_node<char,_false> *)this;
      }
    }
  }
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
  ;
LAB_00145abc:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> concat_sub_tree(const ref<tree_node<T, atomic_ref_counting>>& left_node, uint32_t left_shift, const ref<tree_node<T, atomic_ref_counting>>& right_node, uint32_t right_shift, bool is_top)
      {
      if (left_shift > right_shift)
        {
        // Left tree is higher than right tree
        ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
        ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node, right_shift, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, empty, left_shift, is_top);
        }
      else if (left_shift < right_shift)
        {
        ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
        ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node, left_shift, right_node_temp, right_shift - bits<N>::rrb_bits, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(empty, centre_node, right_internal, right_shift, is_top);
        }
      else
        { // we have same height
        if (left_shift == 0)
          { // We're dealing with leaf nodes
          ref<leaf_node<T, atomic_ref_counting>> left_leaf = left_node;
          ref<leaf_node<T, atomic_ref_counting>> right_leaf = right_node;
          // We don't do this if we're not at top, as we'd have to zip stuff above
          // as well.
          if (is_top && (left_leaf->len + right_leaf->len) <= bits<N>::rrb_branching)
            {
            // Can put them in a single node
            ref<internal_node<T, atomic_ref_counting>> merged = leaf_node_merge<T, atomic_ref_counting>(left_leaf.ptr, right_leaf.ptr);
            return internal_node_new_above1(merged);
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
            ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
            return internal_node_new_above(left_internal, right_internal);
            }
          }
        else
          { // two internal nodes with same height. Move both down
          ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
          ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
          ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
          ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
          ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node_temp, right_shift - bits<N>::rrb_bits, false);
          // can be optimised: since left_shift == right_shift, we'll end up in this
          // block again.
          return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, right_internal, left_shift, is_top);
          }
        }
      }